

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

PSymbol * __thiscall ZCCCompiler::CompileNode(ZCCCompiler *this,ZCC_NamedNode *node)

{
  char *pcVar1;
  FName local_34;
  ZCCCompiler *local_30;
  PSymbolConst *sym;
  ZCC_ConstantDef *def;
  ZCC_NamedNode *node_local;
  ZCCCompiler *this_local;
  
  def = (ZCC_ConstantDef *)node;
  node_local = (ZCC_NamedNode *)this;
  if (node == (ZCC_NamedNode *)0x0) {
    __assert_fail("node != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0x211,"PSymbol *ZCCCompiler::CompileNode(ZCC_NamedNode *)");
  }
  if ((node->super_ZCC_TreeNode).NodeType == AST_ConstantDef) {
    local_30 = (ZCCCompiler *)node[1].super_ZCC_TreeNode.SiblingPrev;
    sym = (PSymbolConst *)node;
    if (local_30 == (ZCCCompiler *)0x1) {
      FName::FName(&local_34,node->NodeName);
      pcVar1 = FName::GetChars(&local_34);
      Error(this,&node->super_ZCC_TreeNode,"Definition of \'%s\' is infinitely recursive",pcVar1);
      local_30 = (ZCCCompiler *)0x0;
    }
    else {
      if (local_30 != (ZCCCompiler *)0x0) {
        __assert_fail("sym == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                      ,0x21e,"PSymbol *ZCCCompiler::CompileNode(ZCC_NamedNode *)");
      }
      local_30 = (ZCCCompiler *)CompileConstant(this,(ZCC_ConstantDef *)node);
    }
    this_local = local_30;
  }
  else {
    this_local = (ZCCCompiler *)0x0;
  }
  return (PSymbol *)this_local;
}

Assistant:

PSymbol *ZCCCompiler::CompileNode(ZCC_NamedNode *node)
{
	assert(node != NULL);
	if (node->NodeType == AST_ConstantDef)
	{
		ZCC_ConstantDef *def = static_cast<ZCC_ConstantDef *>(node);
		PSymbolConst *sym = def->Symbol;

		if (sym == DEFINING_CONST)
		{
			Error(node, "Definition of '%s' is infinitely recursive", FName(node->NodeName).GetChars());
			sym = NULL;
		}
		else
		{
			assert(sym == NULL);
			sym = CompileConstant(def);
		}
		return sym;
	}
	else if (node->NodeType == AST_Struct)
	{

	}
	return NULL;
}